

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O3

char * vtense(char *subj,char *verb)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  void *pvVar8;
  char *pcVar9;
  long lVar10;
  char *__s;
  char *pcVar11;
  char **ppcVar12;
  
  iVar2 = nextobuf_bufidx + 1 >> 0x1f;
  nextobuf_bufidx =
       nextobuf_bufidx + (((uint)((nextobuf_bufidx + 1) / 6 + iVar2) >> 1) - iVar2) * -0xc + 1;
  lVar5 = (long)nextobuf_bufidx * 0x100;
  pcVar9 = nextobuf_bufs + lVar5;
  if (((subj != (char *)0x0) && (iVar2 = strncasecmp(subj,"a ",2), iVar2 != 0)) &&
     (iVar2 = strncasecmp(subj,"an ",3), iVar2 != 0)) {
    for (pcVar6 = strchr(subj,0x20); pcVar6 != (char *)0x0; pcVar6 = strchr(pcVar6 + 1,0x20)) {
      iVar2 = strncmp(pcVar6," of ",4);
      if (((iVar2 == 0) || (iVar2 = strncmp(pcVar6," from ",6), iVar2 == 0)) ||
         ((iVar2 = strncmp(pcVar6," called ",8), iVar2 == 0 ||
          ((iVar2 = strncmp(pcVar6," named ",7), iVar2 == 0 ||
           (iVar2 = strncmp(pcVar6," labeled ",9), iVar2 == 0)))))) {
        if (pcVar6 != subj) goto LAB_00204e70;
        break;
      }
    }
    sVar7 = strlen(subj);
    pcVar6 = subj + (int)sVar7;
LAB_00204e70:
    cVar1 = pcVar6[-1];
    pcVar11 = pcVar6 + (-1 - (long)subj);
    if (((pcVar11 == (char *)0x0 || cVar1 != 's') || (pcVar6[-2] == 's')) || (pcVar6[-2] == 'u')) {
      pcVar11 = pcVar6 + (-1 - (long)subj);
      if ((long)pcVar11 < 4) {
        if (pcVar11 == (char *)0x3) goto LAB_00204ed4;
        if (1 < (long)pcVar11) goto LAB_00204efa;
        goto LAB_00204f83;
      }
      iVar2 = strncmp(pcVar6 + -4,"eeth",4);
      if (iVar2 != 0) {
LAB_00204ed4:
        iVar2 = strncmp(pcVar6 + -4,"feet",4);
        if (iVar2 != 0) {
LAB_00204efa:
          if (pcVar6[-2] == 'a') {
            if (cVar1 != 'e') goto LAB_00204f83;
          }
          else if ((pcVar6[-2] != 'i') || (cVar1 != 'a')) {
LAB_00204f83:
            iVar2 = strncasecmp(subj,"they",0xffffffffffffffff);
            if ((iVar2 == 0) || (iVar2 = strncasecmp(subj,"you",0xffffffffffffffff), iVar2 == 0))
            goto LAB_00205070;
            goto LAB_00204fc3;
          }
        }
      }
    }
    iVar2 = (int)pcVar11 + 1;
    __s = "erinys";
    ppcVar12 = special_subjs;
    do {
      ppcVar12 = ppcVar12 + 1;
      sVar7 = strlen(__s);
      iVar4 = (int)sVar7;
      if ((iVar2 == iVar4) && (iVar3 = strncasecmp(__s,subj,(long)iVar2), iVar3 == 0))
      goto LAB_00204fc3;
      if (iVar4 <= (int)pcVar11) {
        if ((pcVar6[-1 - (long)iVar4] == ' ') &&
           (iVar4 = strncasecmp(__s,pcVar6 + (-1 - (long)iVar4) + 1,(long)iVar4), iVar4 == 0))
        goto LAB_00204fc3;
      }
      __s = *ppcVar12;
    } while (__s != (char *)0x0);
LAB_00205070:
    pcVar9 = strcpy(pcVar9,verb);
    return pcVar9;
  }
LAB_00204fc3:
  sVar7 = strlen(verb);
  iVar2 = strcmp(verb,"are");
  if (iVar2 == 0) {
    nextobuf_bufs[lVar5 + 2] = 0;
    pcVar9[0] = 'i';
    pcVar9[1] = 's';
    return pcVar9;
  }
  iVar2 = strcmp(verb,"have");
  if (iVar2 == 0) {
    builtin_strncpy(nextobuf_bufs + lVar5,"has",4);
    return pcVar9;
  }
  iVar2 = (int)sVar7;
  lVar10 = (long)iVar2;
  cVar1 = verb[lVar10 + -1];
  pvVar8 = memchr("zxs",(int)cVar1,4);
  if (pvVar8 == (void *)0x0) {
    if ((iVar2 < 2) || (cVar1 != 'h')) {
      if ((iVar2 != 2) || (cVar1 != 'o')) {
        if ((cVar1 == 'y') &&
           (pcVar6 = strchr("aeiouAEIOU",(int)verb[lVar10 + -2]), pcVar6 == (char *)0x0)) {
          strcpy(pcVar9,verb);
          *(undefined4 *)(lVar5 + 0x3307df + lVar10) = 0x736569;
          return pcVar9;
        }
        goto LAB_002050e8;
      }
    }
    else {
      cVar1 = verb[lVar10 + -2];
      if (((cVar1 != '\0') && (cVar1 != 'c')) && (cVar1 != 's')) {
LAB_002050e8:
        strcpy(pcVar9,verb);
        sVar7 = strlen(pcVar9);
        (pcVar9 + sVar7)[0] = 's';
        (pcVar9 + sVar7)[1] = '\0';
        return pcVar9;
      }
    }
  }
  strcpy(pcVar9,verb);
  sVar7 = strlen(pcVar9);
  (pcVar9 + sVar7)[0] = 'e';
  (pcVar9 + sVar7)[1] = 's';
  *(undefined1 *)(lVar5 + 0x3307e2 + sVar7) = 0;
  return pcVar9;
}

Assistant:

char *vtense(const char *subj, const char *verb)
{
	char *buf = nextobuf();
	int len, ltmp;
	const char *sp, *spot;
	const char * const *spec;

	/*
	 * verb is given in plural (without trailing s).  Return as input
	 * if subj appears to be plural.  Add special cases as necessary.
	 * Many hard cases can already be handled by using otense() instead.
	 * If this gets much bigger, consider decomposing makeplural.
	 * Note: monster names are not expected here (except before corpse).
	 *
	 * special case: allow null sobj to get the singular 3rd person
	 * present tense form so we don't duplicate this code elsewhere.
	 */
	if (subj) {
	    if (!strncmpi(subj, "a ", 2) || !strncmpi(subj, "an ", 3))
		goto sing;
	    spot = NULL;
	    for (sp = subj; (sp = strchr(sp, ' ')) != 0; ++sp) {
		if (!strncmp(sp, " of ", 4) ||
		    !strncmp(sp, " from ", 6) ||
		    !strncmp(sp, " called ", 8) ||
		    !strncmp(sp, " named ", 7) ||
		    !strncmp(sp, " labeled ", 9)) {
		    if (sp != subj) spot = sp - 1;
		    break;
		}
	    }
	    len = (int) strlen(subj);
	    if (!spot) spot = subj + len - 1;

	    /*
	     * plural: anything that ends in 's', but not '*us' or '*ss'.
	     * Guess at a few other special cases that makeplural creates.
	     */
	    if ((*spot == 's' && spot != subj &&
			(*(spot-1) != 'u' && *(spot-1) != 's')) ||
		((spot - subj) >= 4 && !strncmp(spot-3, "eeth", 4)) ||
		((spot - subj) >= 3 && !strncmp(spot-3, "feet", 4)) ||
		((spot - subj) >= 2 && !strncmp(spot-1, "ia", 2)) ||
		((spot - subj) >= 2 && !strncmp(spot-1, "ae", 2))) {
		/* check for special cases to avoid false matches */
		len = (int)(spot - subj) + 1;
		for (spec = special_subjs; *spec; spec++) {
		    ltmp = strlen(*spec);
		    if (len == ltmp && !strncmpi(*spec, subj, len)) goto sing;
		    /* also check for <prefix><space><special_subj>
		       to catch things like "the invisible erinys" */
		    if (len > ltmp && *(spot - ltmp) == ' ' &&
			   !strncmpi(*spec, spot - ltmp + 1, ltmp)) goto sing;
		}

		return strcpy(buf, verb);
	    }
	    /*
	     * 3rd person plural doesn't end in telltale 's';
	     * 2nd person singular behaves as if plural.
	     */
	    if (!strcmpi(subj, "they") || !strcmpi(subj, "you"))
		return strcpy(buf, verb);
	}

 sing:
	len = strlen(verb);
	spot = verb + len - 1;

	if (!strcmp(verb, "are"))
	    strcpy(buf, "is");
	else if (!strcmp(verb, "have"))
	    strcpy(buf, "has");
	else if (strchr("zxs", *spot) ||
		 (len >= 2 && *spot=='h' && strchr("cs", *(spot-1))) ||
		 (len == 2 && *spot == 'o')) {
	    /* Ends in z, x, s, ch, sh; add an "es" */
	    strcpy(buf, verb);
	    strcat(buf, "es");
	} else if (*spot == 'y' && (!strchr(vowels, *(spot-1)))) {
	    /* like "y" case in makeplural */
	    strcpy(buf, verb);
	    strcpy(buf + len - 1, "ies");
	} else {
	    strcpy(buf, verb);
	    strcat(buf, "s");
	}

	return buf;
}